

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void google::LogDestination::WaitForSinks(LogMessageData *data)

{
  code *pcVar1;
  bool bVar2;
  size_type sVar3;
  reference ppLVar4;
  bool send_to_sink;
  int local_1c;
  int i;
  ReaderMutexLock l;
  LogMessageData *data_local;
  
  l.mu_ = (Mutex *)data;
  ::glog_internal_namespace_::ReaderMutexLock::ReaderMutexLock
            ((ReaderMutexLock *)&stack0xffffffffffffffe8,(Mutex *)sink_mutex_);
  if (sinks_ != (vector<google::LogSink_*,_std::allocator<google::LogSink_*>_> *)0x0) {
    sVar3 = std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>::size(sinks_);
    local_1c = (int)sVar3;
    while (local_1c = local_1c + -1, -1 < local_1c) {
      ppLVar4 = std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>::operator[]
                          (sinks_,(long)local_1c);
      (*(*ppLVar4)->_vptr_LogSink[3])();
    }
  }
  pcVar1 = *(code **)((long)&l.mu_[0x1da].mutex_ + 0x20);
  bVar2 = true;
  if (pcVar1 != LogMessage::SendToSink ||
      pcVar1 != (code *)0x0 && l.mu_[0x1da].mutex_.__data.__pad2 != 0) {
    pcVar1 = *(code **)((long)&l.mu_[0x1da].mutex_ + 0x20);
    bVar2 = pcVar1 == LogMessage::SendToSinkAndLog &&
            (pcVar1 == (code *)0x0 || l.mu_[0x1da].mutex_.__data.__pad2 == 0);
  }
  if ((bVar2) && (*(long *)((long)&l.mu_[0x1da].mutex_ + 0x30) != 0)) {
    (**(code **)(**(long **)((long)&l.mu_[0x1da].mutex_ + 0x30) + 0x18))();
  }
  ::glog_internal_namespace_::ReaderMutexLock::~ReaderMutexLock
            ((ReaderMutexLock *)&stack0xffffffffffffffe8);
  return;
}

Assistant:

inline void LogDestination::WaitForSinks(LogMessage::LogMessageData* data) {
  ReaderMutexLock l(&sink_mutex_);
  if (sinks_) {
    for (int i = sinks_->size() - 1; i >= 0; i--) {
      (*sinks_)[i]->WaitTillSent();
    }
  }
  const bool send_to_sink =
      (data->send_method_ == &LogMessage::SendToSink) ||
      (data->send_method_ == &LogMessage::SendToSinkAndLog);
  if (send_to_sink && data->sink_ != NULL) {
    data->sink_->WaitTillSent();
  }
}